

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  JunitReporter *in_RDI;
  
  ~JunitReporter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}